

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O2

bool __thiscall
ithipublisher::GetAverageAndCurrent
          (ithipublisher *this,char *metric_name,char *key_value,double *average,double *current)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  vector<double,_std::allocator<double>_> val;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetVector(this,metric_name,key_value,(vector<double,_std::allocator<double>_> *)&local_38);
  *average = 0.0;
  *current = 0.0;
  lVar2 = (long)this->nb_months;
  if (1 < lVar2) {
    dVar4 = 0.0;
    for (uVar3 = 0; this->nb_months - 1 != uVar3; uVar3 = uVar3 + 1) {
      dVar4 = dVar4 + local_38._M_impl.super__Vector_impl_data._M_start[uVar3];
    }
    lVar1 = lVar2 + -1;
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    *average = dVar4 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
  }
  *current = local_38._M_impl.super__Vector_impl_data._M_start[lVar2 + -1];
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return true;
}

Assistant:

bool ithipublisher::GetAverageAndCurrent(char const * metric_name, char const * key_value, double * average, double * current)
{
    std::vector<double>  val;
    bool ret = GetVector(metric_name, key_value, &val);
    double sum = 0;

    *average = 0;
    *current = 0;

    if (ret)
    {
        if (nb_months > 1)
        {
            for (int i = 0; i < nb_months - 1; i++)
            {
                sum += val[i];
            }
            *average = sum / (double)(((size_t)nb_months) - 1);
        }

        *current = val[(size_t)nb_months - 1];
    }
    
    return ret;
}